

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O1

bool __thiscall
avro::parsing::
equalsFirst<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
::operator()(equalsFirst<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
             *this,pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                   *p)

{
  size_t __n;
  int iVar1;
  
  __n = (p->first)._M_string_length;
  if (__n != this->v_->_M_string_length) {
    return false;
  }
  if (__n != 0) {
    iVar1 = bcmp((p->first)._M_dataplus._M_p,(this->v_->_M_dataplus)._M_p,__n);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

bool operator()(const pair<T1, T2>& p) {
        return p.first == v_;
    }